

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary(FILE *fp,void **argtable,char *format)

{
  byte *pbVar1;
  undefined8 uVar2;
  char *__format;
  char syntax [200];
  char *in_stack_ffffffffffffff08;
  
  __format = "  %-20s %s\n";
  if (format != (char *)0x0) {
    __format = format;
  }
  for (; pbVar1 = (byte *)*argtable, (*pbVar1 & 1) == 0; argtable = argtable + 1) {
    if (*(long *)(pbVar1 + 0x20) != 0) {
      memset(&stack0xffffffffffffff08,0,200);
      uVar2 = *(undefined8 *)(pbVar1 + 0x20);
      arg_cat_optionv(&stack0xffffffffffffff08,*(size_t *)(pbVar1 + 8),*(char **)(pbVar1 + 0x10),
                      *(char **)(pbVar1 + 0x18),(char *)(ulong)(*pbVar1 & 4),0x10a654,
                      in_stack_ffffffffffffff08);
      fprintf((FILE *)fp,__format,&stack0xffffffffffffff08,uVar2);
    }
  }
  return;
}

Assistant:

void arg_print_glossary(FILE * fp, void * *argtable, const char * format) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int tabindex;

	format = format ? format : "  %-20s %s\n";

	for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
		if (table[tabindex]->glossary) {
			char syntax[200] = "";
			const char * shortopts = table[tabindex]->shortopts;
			const char * longopts  = table[tabindex]->longopts;
			const char * datatype  = table[tabindex]->datatype;
			const char * glossary  = table[tabindex]->glossary;
			arg_cat_optionv(syntax,
							sizeof(syntax),
							shortopts,
							longopts,
							datatype,
							table[tabindex]->flag & ARG_HASOPTVALUE,
							", ");
			fprintf(fp, format, syntax, glossary);
		}
	}
}